

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O2

void __thiscall duckdb::WindowAggregateStates::Finalize(WindowAggregateStates *this,Vector *result)

{
  aggregate_finalize_t p_Var1;
  type pVVar2;
  AggregateInputData aggr_input_data;
  AggregateInputData local_38;
  
  local_38.bind_data.ptr = AggregateObject::GetFunctionData(&this->aggr);
  local_38.allocator = &this->allocator;
  local_38.combine_type = PRESERVE_INPUT;
  p_Var1 = (this->aggr).function.finalize;
  pVVar2 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&this->statef);
  (*p_Var1)(pVVar2,&local_38,result,
            (ulong)((long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                          .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) / this->state_size,0);
  return;
}

Assistant:

void WindowAggregateStates::Finalize(Vector &result) {
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(*statef, aggr_input_data, result, GetCount(), 0);
}